

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformBlockTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_1::createBlockBasicTypeCases
               (TestCaseGroup *group,Context *context,char *name,VarType *type,deUint32 layoutFlags,
               int numInstances)

{
  TestNode *pTVar1;
  long *plVar2;
  long *plVar3;
  int in_stack_ffffffffffffff78;
  allocator<char> local_79;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58 [2];
  long local_48 [2];
  TestNode *local_38;
  
  local_38 = &group->super_TestNode;
  pTVar1 = (TestNode *)operator_new(0xb0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,name,&local_79);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_58);
  local_78 = &local_68;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_68 = *plVar3;
    lStack_60 = plVar2[3];
  }
  else {
    local_68 = *plVar3;
    local_78 = (long *)*plVar2;
  }
  local_70 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar1,context,(char *)local_78,(char *)type,
             (VarType *)(ulong)(layoutFlags | 0x100),numInstances,in_stack_ffffffffffffff78);
  tcu::TestNode::addChild(local_38,pTVar1);
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  pTVar1 = (TestNode *)operator_new(0xb0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,name,&local_79);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_58);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_68 = *plVar3;
    lStack_60 = plVar2[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar3;
    local_78 = (long *)*plVar2;
  }
  local_70 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar1,context,(char *)local_78,(char *)type,
             (VarType *)(ulong)(layoutFlags | 0x200),numInstances,in_stack_ffffffffffffff78);
  tcu::TestNode::addChild(local_38,pTVar1);
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if ((layoutFlags & 0x10) == 0) {
    pTVar1 = (TestNode *)operator_new(0xb0);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,name,&local_79);
    plVar2 = (long *)std::__cxx11::string::append((char *)local_58);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_68 = *plVar3;
      lStack_60 = plVar2[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar3;
      local_78 = (long *)*plVar2;
    }
    local_70 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    BlockBasicTypeCase::BlockBasicTypeCase
              ((BlockBasicTypeCase *)pTVar1,context,(char *)local_78,(char *)type,
               (VarType *)(ulong)(layoutFlags | 0x300),numInstances,in_stack_ffffffffffffff78);
    tcu::TestNode::addChild(local_38,pTVar1);
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
  }
  return;
}

Assistant:

static void createBlockBasicTypeCases (tcu::TestCaseGroup* group, Context& context, const char* name, const VarType& type, deUint32 layoutFlags, int numInstances = 0)
{
	group->addChild(new BlockBasicTypeCase(context, (string(name) + "_vertex").c_str(),		"", type, layoutFlags|DECLARE_VERTEX,					numInstances));
	group->addChild(new BlockBasicTypeCase(context, (string(name) + "_fragment").c_str(),	"", type, layoutFlags|DECLARE_FRAGMENT,					numInstances));

	if (!(layoutFlags & LAYOUT_PACKED))
		group->addChild(new BlockBasicTypeCase(context, (string(name) + "_both").c_str(),	"", type, layoutFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	numInstances));
}